

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanInstance.cpp
# Opt level: O1

VkPhysicalDevice __thiscall
VulkanUtilities::VulkanInstance::SelectPhysicalDevice(VulkanInstance *this,uint32_t AdapterId)

{
  pointer ppVVar1;
  pointer ppVVar2;
  VkPhysicalDevice this_00;
  ulong uVar3;
  bool bVar4;
  VkPhysicalDevice pVVar5;
  undefined4 in_register_00000034;
  VkPhysicalDeviceProperties *Device;
  pointer ppVVar6;
  undefined4 in_stack_fffffffffffffc58;
  uint local_3a0;
  uint local_39c;
  uint local_398;
  uint local_394;
  uint local_390;
  uint local_38c;
  string _msg;
  VkPhysicalDeviceProperties DeviceProps;
  
  uVar3 = (ulong)AdapterId;
  ppVVar1 = (this->m_PhysicalDevices).
            super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((uVar3 < (ulong)((long)(this->m_PhysicalDevices).
                             super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar1 >> 3)) &&
     (bVar4 = SelectPhysicalDevice::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)ppVVar1[uVar3],
                         (VkPhysicalDevice)CONCAT44(in_register_00000034,AdapterId)), bVar4)) {
    pVVar5 = (this->m_PhysicalDevices).
             super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>._M_impl
             .super__Vector_impl_data._M_start[uVar3];
  }
  else {
    pVVar5 = (VkPhysicalDevice)0x0;
  }
  if (pVVar5 == (VkPhysicalDevice)0x0) {
    ppVVar1 = (this->m_PhysicalDevices).
              super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppVVar2 = (this->m_PhysicalDevices).
              super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppVVar1 == ppVVar2) {
      pVVar5 = (VkPhysicalDevice)0x0;
    }
    else {
      pVVar5 = (VkPhysicalDevice)0x0;
      do {
        ppVVar6 = ppVVar1 + 1;
        this_00 = *ppVVar1;
        Device = &DeviceProps;
        (*vkGetPhysicalDeviceProperties)(this_00,&DeviceProps);
        bVar4 = SelectPhysicalDevice::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)this_00,(VkPhysicalDevice)Device);
        if (bVar4) {
          pVVar5 = this_00;
        }
      } while ((!bVar4 || DeviceProps.deviceType != VK_PHYSICAL_DEVICE_TYPE_DISCRETE_GPU) &&
              (ppVVar1 = ppVVar6, ppVVar6 != ppVVar2));
    }
  }
  if (pVVar5 == (VkPhysicalDevice)0x0) {
    Diligent::LogError<true,char[40]>
              (false,"SelectPhysicalDevice",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x2a5,(char (*) [40])"Failed to find suitable physical device");
  }
  else {
    (*vkGetPhysicalDeviceProperties)(pVVar5,&DeviceProps);
    local_38c = DeviceProps.apiVersion >> 0x16 & 0x7f;
    local_3a0 = DeviceProps.apiVersion >> 0xc & 0x3ff;
    local_390 = DeviceProps.apiVersion & 0xfff;
    local_394 = DeviceProps.driverVersion >> 0x16 & 0x7f;
    local_398 = DeviceProps.driverVersion >> 0xc & 0x3ff;
    local_39c = DeviceProps.driverVersion & 0xfff;
    Diligent::
    FormatString<char[24],char[256],char[16],unsigned_int,char,unsigned_int,char,unsigned_int,char[18],unsigned_int,char,unsigned_int,char,unsigned_int,char>
              (&_msg,(Diligent *)"Using physical device \'",(char (*) [24])DeviceProps.deviceName,
               (char (*) [256])"\', API version ",(char (*) [16])&local_38c,
               (uint *)&stack0xfffffffffffffc5f,(char *)&local_3a0,(uint *)&stack0xfffffffffffffc5b,
               (char *)&local_390,(uint *)", Driver version ",(char (*) [18])&local_394,
               (uint *)&stack0xfffffffffffffc5e,(char *)&local_398,(uint *)&stack0xfffffffffffffc5d,
               (char *)&local_39c,(uint *)&stack0xfffffffffffffc5c,
               (char *)CONCAT17(0x2e,CONCAT16(0x2e,CONCAT15(0x2e,CONCAT14(0x2e,CONCAT13(0x2e,(int3)
                                                  in_stack_fffffffffffffc58))))));
    if (Diligent::DebugMessageCallback != (undefined *)0x0) {
      (*(code *)Diligent::DebugMessageCallback)(0,_msg._M_dataplus._M_p,0,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_msg._M_dataplus._M_p != &_msg.field_2) {
      operator_delete(_msg._M_dataplus._M_p,_msg.field_2._M_allocated_capacity + 1);
    }
  }
  return pVVar5;
}

Assistant:

VkPhysicalDevice VulkanInstance::SelectPhysicalDevice(uint32_t AdapterId) const noexcept(false)
{
    const auto IsGraphicsAndComputeQueueSupported = [](VkPhysicalDevice Device) {
        uint32_t QueueFamilyCount = 0;
        vkGetPhysicalDeviceQueueFamilyProperties(Device, &QueueFamilyCount, nullptr);
        VERIFY_EXPR(QueueFamilyCount > 0);
        std::vector<VkQueueFamilyProperties> QueueFamilyProperties(QueueFamilyCount);
        vkGetPhysicalDeviceQueueFamilyProperties(Device, &QueueFamilyCount, QueueFamilyProperties.data());
        VERIFY_EXPR(QueueFamilyCount == QueueFamilyProperties.size());

        // If an implementation exposes any queue family that supports graphics operations,
        // at least one queue family of at least one physical device exposed by the implementation
        // must support both graphics and compute operations.
        for (const auto& QueueFamilyProps : QueueFamilyProperties)
        {
            if ((QueueFamilyProps.queueFlags & VK_QUEUE_GRAPHICS_BIT) != 0 &&
                (QueueFamilyProps.queueFlags & VK_QUEUE_COMPUTE_BIT) != 0)
            {
                return true;
            }
        }
        return false;
    };

    VkPhysicalDevice SelectedPhysicalDevice = VK_NULL_HANDLE;

    if (AdapterId < m_PhysicalDevices.size() &&
        IsGraphicsAndComputeQueueSupported(m_PhysicalDevices[AdapterId]))
    {
        SelectedPhysicalDevice = m_PhysicalDevices[AdapterId];
    }

    // Select a device that exposes a queue family that supports both compute and graphics operations.
    // Prefer discrete GPU.
    if (SelectedPhysicalDevice == VK_NULL_HANDLE)
    {
        for (auto Device : m_PhysicalDevices)
        {
            VkPhysicalDeviceProperties DeviceProps;
            vkGetPhysicalDeviceProperties(Device, &DeviceProps);

            if (IsGraphicsAndComputeQueueSupported(Device))
            {
                SelectedPhysicalDevice = Device;
                if (DeviceProps.deviceType == VK_PHYSICAL_DEVICE_TYPE_DISCRETE_GPU)
                    break;
            }
        }
    }

    if (SelectedPhysicalDevice != VK_NULL_HANDLE)
    {
        VkPhysicalDeviceProperties SelectedDeviceProps;
        vkGetPhysicalDeviceProperties(SelectedPhysicalDevice, &SelectedDeviceProps);
        LOG_INFO_MESSAGE("Using physical device '", SelectedDeviceProps.deviceName,
                         "', API version ",
                         VK_API_VERSION_MAJOR(SelectedDeviceProps.apiVersion), '.',
                         VK_API_VERSION_MINOR(SelectedDeviceProps.apiVersion), '.',
                         VK_API_VERSION_PATCH(SelectedDeviceProps.apiVersion),
                         ", Driver version ",
                         VK_API_VERSION_MAJOR(SelectedDeviceProps.driverVersion), '.',
                         VK_API_VERSION_MINOR(SelectedDeviceProps.driverVersion), '.',
                         VK_API_VERSION_PATCH(SelectedDeviceProps.driverVersion), '.');
    }
    else
    {
        LOG_ERROR_AND_THROW("Failed to find suitable physical device");
    }

    return SelectedPhysicalDevice;
}